

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::accumulateDerivativesDispatch1<true>
          (BeagleCPUImpl<float,_1,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  if (outSumDerivatives == (double *)0x0) {
    BeagleCPUImpl<float,1,0>::accumulateDerivativesDispatch2<true,false>
              ((BeagleCPUImpl<float,1,0> *)this,outDerivatives,(double *)0x0,
               outSumSquaredDerivatives);
    return;
  }
  BeagleCPUImpl<float,1,0>::accumulateDerivativesDispatch2<true,true>
            ((BeagleCPUImpl<float,1,0> *)this,outDerivatives,outSumDerivatives,
             outSumSquaredDerivatives);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE template <bool DoDerivatives>
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch1(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumDerivatives == NULL) {
        accumulateDerivativesDispatch2<DoDerivatives, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch2<DoDerivatives, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}